

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::GetBBox(ON_Mesh *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  ON_BoundingBox local_98;
  undefined1 local_68 [8];
  ON_BoundingBox vbox;
  ON_3dPointArray *dV;
  uint vertex_count;
  uint facet_count;
  bool rc;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_Mesh *this_local;
  
  vertex_count._2_1_ = false;
  iVar2 = FaceCount(this);
  uVar3 = VertexCount(this);
  if ((iVar2 != 0) && (2 < uVar3)) {
    vertex_count._2_1_ = ON_BoundingBox::IsNotEmpty(&this->m_vertex_bbox);
    if (!vertex_count._2_1_) {
      bVar1 = HasDoublePrecisionVertices(this);
      if (bVar1) {
        vbox.m_max.z = (double)DoublePrecisionVertices(this);
        uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                          ((ON_SimpleArray<ON_3dPoint> *)vbox.m_max.z);
        uVar4 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                          (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        if (uVar3 == uVar4) {
          vertex_count._2_1_ =
               ON_BoundingBox::Set(&this->m_vertex_bbox,(ON_SimpleArray<ON_3dPoint> *)vbox.m_max.z,0
                                  );
        }
      }
      if (vertex_count._2_1_ == false) {
        vertex_count._2_1_ =
             ON_BoundingBox::Set(&this->m_vertex_bbox,&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,
                                 0);
      }
    }
    if (vertex_count._2_1_ != false) {
      memcpy(local_68,&this->m_vertex_bbox,0x30);
      if (bGrowBox) {
        ON_3dPoint::ON_3dPoint(&local_b0,boxmin);
        ON_3dPoint::ON_3dPoint(&local_c8,boxmax);
        ON_BoundingBox::ON_BoundingBox(&local_98,&local_b0,&local_c8);
        ON_BoundingBox::Union((ON_BoundingBox *)local_68,&local_98);
      }
      *boxmin = (double)local_68;
      boxmin[1] = vbox.m_min.x;
      boxmin[2] = vbox.m_min.y;
      *boxmax = vbox.m_min.z;
      boxmax[1] = vbox.m_max.x;
      boxmax[2] = vbox.m_max.y;
    }
  }
  return vertex_count._2_1_;
}

Assistant:

bool ON_Mesh::GetBBox( // returns true if successful
       double* boxmin, // minimum
       double* boxmax, // maximum
       bool bGrowBox
       ) const
{
  bool rc = false;
  const unsigned int facet_count  = FaceCount();
  const unsigned int vertex_count = VertexCount();
  if ( facet_count >= 1 && vertex_count >= 3 ) 
  {
    rc = m_vertex_bbox.IsNotEmpty();
    if ( false == rc ) 
    {
      if ( HasDoublePrecisionVertices() )
      {
        const ON_3dPointArray& dV = DoublePrecisionVertices();
        if ( dV.UnsignedCount() == m_V.UnsignedCount() )
          rc = m_vertex_bbox.Set(dV, false);
      }
      if (false == rc)
      {
        rc = m_vertex_bbox.Set(m_V, false);
      }
    }

    if ( rc ) 
    {
      ON_BoundingBox vbox(m_vertex_bbox);
      if ( bGrowBox )
      {
        vbox.Union( ON_BoundingBox(ON_3dPoint(boxmin),ON_3dPoint(boxmax)) );
      }
      boxmin[0] = vbox.m_min.x;
      boxmin[1] = vbox.m_min.y;
      boxmin[2] = vbox.m_min.z;
      boxmax[0] = vbox.m_max.x;
      boxmax[1] = vbox.m_max.y;
      boxmax[2] = vbox.m_max.z;
    }
  }
  return rc;
}